

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

void __thiscall Assimp::ExporterPimpl::ExporterPimpl(ExporterPimpl *this)

{
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  *this_00;
  DefaultIOSystem *__p;
  ExportFormatEntry local_58;
  
  this->blob = (aiExportDataBlob *)0x0;
  __p = (DefaultIOSystem *)Intern::AllocateFromAssimpHeap::operator_new(0x20);
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__IOSystem_00759f90;
  std::__shared_ptr<Assimp::IOSystem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::DefaultIOSystem,void>
            ((__shared_ptr<Assimp::IOSystem,(__gnu_cxx::_Lock_policy)2> *)&this->mIOSystem,__p);
  this->mIsDefaultIOHandler = true;
  this->mProgressHandler = (ProgressHandler *)0x0;
  this->mIsDefaultProgressHandler = true;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mError)._M_dataplus._M_p = (pointer)&(this->mError).field_2;
  (this->mError)._M_string_length = 0;
  (this->mError).field_2._M_local_buf[0] = '\0';
  this_00 = &this->mExporters;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetPostProcessingStepInstanceList(&this->mPostProcessingSteps);
  local_58.mDescription.id = "collada";
  local_58.mDescription.description = "COLLADA - Digital Asset Exchange Schema";
  local_58.mDescription.fileExtension = "dae";
  local_58.mExportFunction = ExportSceneCollada;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "x";
  local_58.mDescription.description = "X Files";
  local_58.mDescription.fileExtension = "x";
  local_58.mExportFunction = ExportSceneXFile;
  local_58.mEnforcePP = 0x1800004;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "stp";
  local_58.mDescription.description = "Step Files";
  local_58.mDescription.fileExtension = "stp";
  local_58.mExportFunction = ExportSceneStep;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "obj";
  local_58.mDescription.description = "Wavefront OBJ format";
  local_58.mDescription.fileExtension = "obj";
  local_58.mExportFunction = ExportSceneObj;
  local_58.mEnforcePP = 0x40;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "objnomtl";
  local_58.mDescription.description = "Wavefront OBJ format without material file";
  local_58.mDescription.fileExtension = "obj";
  local_58.mExportFunction = ExportSceneObjNoMtl;
  local_58.mEnforcePP = 0x40;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "stl";
  local_58.mDescription.description = "Stereolithography";
  local_58.mDescription.fileExtension = "stl";
  local_58.mExportFunction = ExportSceneSTL;
  local_58.mEnforcePP = 0x128;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "stlb";
  local_58.mDescription.description = "Stereolithography (binary)";
  local_58.mDescription.fileExtension = "stl";
  local_58.mExportFunction = ExportSceneSTLBinary;
  local_58.mEnforcePP = 0x128;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "ply";
  local_58.mDescription.description = "Stanford Polygon Library";
  local_58.mDescription.fileExtension = "ply";
  local_58.mExportFunction = ExportScenePly;
  local_58.mEnforcePP = 0x100;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "plyb";
  local_58.mDescription.description = "Stanford Polygon Library (binary)";
  local_58.mDescription.fileExtension = "ply";
  local_58.mExportFunction = ExportScenePlyBinary;
  local_58.mEnforcePP = 0x100;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "3ds";
  local_58.mDescription.description = "Autodesk 3DS (legacy)";
  local_58.mDescription.fileExtension = "3ds";
  local_58.mExportFunction = ExportScene3DS;
  local_58.mEnforcePP = 0x800a;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "gltf2";
  local_58.mDescription.description = "GL Transmission Format v. 2";
  local_58.mDescription.fileExtension = "gltf";
  local_58.mExportFunction = ExportSceneGLTF2;
  local_58.mEnforcePP = 0x800a;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "glb2";
  local_58.mDescription.description = "GL Transmission Format v. 2 (binary)";
  local_58.mDescription.fileExtension = "glb";
  local_58.mExportFunction = ExportSceneGLB2;
  local_58.mEnforcePP = 0x800a;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "gltf";
  local_58.mDescription.description = "GL Transmission Format";
  local_58.mDescription.fileExtension = "gltf";
  local_58.mExportFunction = ExportSceneGLTF;
  local_58.mEnforcePP = 0x800a;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "glb";
  local_58.mDescription.description = "GL Transmission Format (binary)";
  local_58.mDescription.fileExtension = "glb";
  local_58.mExportFunction = ExportSceneGLB;
  local_58.mEnforcePP = 0x800a;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "assbin";
  local_58.mDescription.description = "Assimp Binary File";
  local_58.mDescription.fileExtension = "assbin";
  local_58.mExportFunction = ExportSceneAssbin;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "assxml";
  local_58.mDescription.description = "Assimp XML Document";
  local_58.mDescription.fileExtension = "assxml";
  local_58.mExportFunction = ExportSceneAssxml;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "x3d";
  local_58.mDescription.description = "Extensible 3D";
  local_58.mDescription.fileExtension = "x3d";
  local_58.mExportFunction = ExportSceneX3D;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "fbx";
  local_58.mDescription.description = "Autodesk FBX (binary)";
  local_58.mDescription.fileExtension = "fbx";
  local_58.mExportFunction = ExportSceneFBX;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "fbxa";
  local_58.mDescription.description = "Autodesk FBX (ascii)";
  local_58.mDescription.fileExtension = "fbx";
  local_58.mExportFunction = ExportSceneFBXA;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "m3d";
  local_58.mDescription.description = "Model 3D (binary)";
  local_58.mDescription.fileExtension = "m3d";
  local_58.mExportFunction = ExportSceneM3D;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "m3da";
  local_58.mDescription.description = "Model 3D (ascii)";
  local_58.mDescription.fileExtension = "a3d";
  local_58.mExportFunction = ExportSceneM3DA;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "3mf";
  local_58.mDescription.description = "The 3MF-File-Format";
  local_58.mDescription.fileExtension = "3mf";
  local_58.mExportFunction = ExportScene3MF;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  local_58.mDescription.id = "assjson";
  local_58.mDescription.description = "Assimp JSON Document";
  local_58.mDescription.fileExtension = "json";
  local_58.mExportFunction = ExportAssimp2Json;
  local_58.mEnforcePP = 0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::emplace_back<Assimp::Exporter::ExportFormatEntry>(this_00,&local_58);
  return;
}

Assistant:

ExporterPimpl()
    : blob()
    , mIOSystem(new Assimp::DefaultIOSystem())
    , mIsDefaultIOHandler(true)
    , mProgressHandler( nullptr )
    , mIsDefaultProgressHandler( true )
    , mPostProcessingSteps()
    , mError()
    , mExporters() {
        GetPostProcessingStepInstanceList(mPostProcessingSteps);

        // grab all built-in exporters
		setupExporterArray(mExporters);
    }